

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  vfloat<4> vVar1;
  byte bVar2;
  BVH *bvh;
  size_t sVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  byte bVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  size_t sVar23;
  char cVar24;
  bool bVar25;
  ulong uVar26;
  long lVar27;
  size_t sVar28;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar29;
  NodeRef root;
  undefined4 uVar30;
  NodeRef *pNVar31;
  byte bVar32;
  uint uVar33;
  byte bVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 ai_3;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  vint4 ai_1;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vint4 ai;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vint4 bi;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vint4 bi_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 in_ZMM4 [64];
  vint4 bi_3;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vint4 ai_2;
  undefined1 auVar75 [16];
  float fVar76;
  float fVar79;
  float fVar80;
  vint4 bi_2;
  float fVar81;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  vfloat4 a0;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  uint local_18e4;
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  int iVar37;
  int iVar51;
  int iVar52;
  int iVar53;
  
  bvh = (BVH *)This->ptr;
  sVar28 = (bvh->root).ptr;
  if (sVar28 != 8) {
    auVar43 = *(undefined1 (*) [16])(ray + 0x80);
    auVar40 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar16 = ZEXT812(0) << 0x20;
    auVar41 = ZEXT816(0) << 0x40;
    uVar10 = vcmpps_avx512vl(auVar43,auVar41,5);
    uVar35 = vpcmpeqd_avx512vl(auVar40,(undefined1  [16])valid_i->field_0);
    uVar35 = ((byte)uVar10 & 0xf) & uVar35;
    bVar34 = (byte)uVar35;
    if (bVar34 != 0) {
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar38._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar38._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar38._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar38._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar39 = vfmadd231ps_fma(auVar38,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar39 = vfmadd231ps_fma(auVar39,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar38 = vrsqrt14ps_avx512vl(auVar39);
      auVar42._8_4_ = 0xbf000000;
      auVar42._0_8_ = 0xbf000000bf000000;
      auVar42._12_4_ = 0xbf000000;
      auVar39 = vmulps_avx512vl(auVar39,auVar42);
      fVar76 = auVar38._0_4_;
      fVar79 = auVar38._4_4_;
      fVar80 = auVar38._8_4_;
      fVar81 = auVar38._12_4_;
      auVar48._0_4_ = fVar76 * fVar76 * fVar76 * auVar39._0_4_;
      auVar48._4_4_ = fVar79 * fVar79 * fVar79 * auVar39._4_4_;
      auVar48._8_4_ = fVar80 * fVar80 * fVar80 * auVar39._8_4_;
      auVar48._12_4_ = fVar81 * fVar81 * fVar81 * auVar39._12_4_;
      auVar39._8_4_ = 0x3fc00000;
      auVar39._0_8_ = 0x3fc000003fc00000;
      auVar39._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar48,auVar38,auVar39);
      auVar49._8_4_ = 0x80000000;
      auVar49._0_8_ = 0x8000000080000000;
      auVar49._12_4_ = 0x80000000;
      uVar26 = uVar35;
      while (uVar26 != 0) {
        lVar27 = 0;
        for (uVar36 = uVar26; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
          lVar27 = lVar27 + 1;
        }
        uVar26 = uVar26 - 1 & uVar26;
        uVar36 = (ulong)(uint)((int)lVar27 * 4);
        auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar36 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar36 + 0x50)),0x1c);
        auVar39 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + uVar36 + 0x60)),0x28);
        fVar76 = *(float *)((long)pre.ray_space + (uVar36 - 0x10));
        auVar82._0_4_ = auVar39._0_4_ * fVar76;
        auVar82._4_4_ = auVar39._4_4_ * fVar76;
        auVar82._8_4_ = auVar39._8_4_ * fVar76;
        auVar82._12_4_ = auVar39._12_4_ * fVar76;
        auVar42 = vshufpd_avx(auVar82,auVar82,1);
        auVar39 = vmovshdup_avx(auVar82);
        auVar88._0_4_ = auVar39._0_4_ ^ 0x80000000;
        auVar39 = vunpckhps_avx(auVar82,auVar41);
        auVar88._4_12_ = auVar16;
        auVar48 = vshufps_avx(auVar39,auVar88,0x41);
        auVar85._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
        auVar85._8_8_ = auVar42._8_8_ ^ auVar49._8_8_;
        auVar39 = vdpps_avx(auVar48,auVar48,0x7f);
        auVar38 = vinsertps_avx(auVar85,auVar82,0x2a);
        auVar42 = vdpps_avx(auVar38,auVar38,0x7f);
        uVar10 = vcmpps_avx512vl(auVar42,auVar39,1);
        auVar39 = vpmovm2d_avx512vl(uVar10);
        auVar91._0_4_ = auVar39._0_4_;
        auVar91._4_4_ = auVar91._0_4_;
        auVar91._8_4_ = auVar91._0_4_;
        auVar91._12_4_ = auVar91._0_4_;
        uVar36 = vpmovd2m_avx512vl(auVar91);
        auVar50._4_4_ = (uint)((byte)(uVar36 >> 1) & 1) * auVar40._4_4_;
        auVar50._0_4_ = (uint)((byte)uVar36 & 1) * auVar40._0_4_;
        auVar50._8_4_ = (uint)((byte)(uVar36 >> 2) & 1) * auVar40._8_4_;
        auVar50._12_4_ = (uint)((byte)(uVar36 >> 3) & 1) * auVar40._12_4_;
        auVar39 = vblendvps_avx(auVar38,auVar48,auVar50);
        auVar42 = vdpps_avx(auVar39,auVar39,0x7f);
        auVar92._4_12_ = auVar16;
        auVar92._0_4_ = auVar42._0_4_;
        auVar38 = vrsqrt14ss_avx512f(auVar41,auVar92);
        fVar79 = auVar38._0_4_;
        fVar79 = fVar79 * 1.5 - auVar42._0_4_ * 0.5 * fVar79 * fVar79 * fVar79;
        auVar86._0_4_ = auVar39._0_4_ * fVar79;
        auVar86._4_4_ = auVar39._4_4_ * fVar79;
        auVar86._8_4_ = auVar39._8_4_ * fVar79;
        auVar86._12_4_ = auVar39._12_4_ * fVar79;
        auVar39 = vshufps_avx(auVar86,auVar86,0xc9);
        auVar42 = vshufps_avx(auVar82,auVar82,0xc9);
        auVar93._0_4_ = auVar86._0_4_ * auVar42._0_4_;
        auVar93._4_4_ = auVar86._4_4_ * auVar42._4_4_;
        auVar93._8_4_ = auVar86._8_4_ * auVar42._8_4_;
        auVar93._12_4_ = auVar86._12_4_ * auVar42._12_4_;
        auVar39 = vfmsub231ps_fma(auVar93,auVar82,auVar39);
        auVar42 = vshufps_avx(auVar39,auVar39,0xc9);
        auVar39 = vdpps_avx(auVar42,auVar42,0x7f);
        auVar94._4_12_ = auVar16;
        auVar94._0_4_ = auVar39._0_4_;
        auVar38 = vrsqrt14ss_avx512f(auVar41,auVar94);
        fVar79 = auVar38._0_4_;
        fVar79 = fVar79 * 1.5 - auVar39._0_4_ * 0.5 * fVar79 * fVar79 * fVar79;
        auVar89._0_4_ = fVar79 * auVar42._0_4_;
        auVar89._4_4_ = fVar79 * auVar42._4_4_;
        auVar89._8_4_ = fVar79 * auVar42._8_4_;
        auVar89._12_4_ = fVar79 * auVar42._12_4_;
        auVar83._0_4_ = fVar76 * auVar82._0_4_;
        auVar83._4_4_ = fVar76 * auVar82._4_4_;
        auVar83._8_4_ = fVar76 * auVar82._8_4_;
        auVar83._12_4_ = fVar76 * auVar82._12_4_;
        auVar38 = vunpcklps_avx(auVar86,auVar83);
        auVar39 = vunpckhps_avx(auVar86,auVar83);
        auVar48 = vunpcklps_avx(auVar89,auVar41);
        auVar42 = vunpckhps_avx(auVar89,auVar41);
        aVar8 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar39,auVar42);
        aVar9 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar38,auVar48);
        aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar38,auVar48);
        pre.ray_space[lVar27].vx.field_0 = aVar9;
        pre.ray_space[lVar27].vy.field_0 = aVar7;
        pre.ray_space[lVar27].vz.field_0 = aVar8;
      }
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar95 = ZEXT1664(auVar40);
      auVar41 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar40);
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar96 = ZEXT1664(auVar39);
      uVar26 = vcmpps_avx512vl(auVar41,auVar39,1);
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar97 = ZEXT1664(auVar41);
      auVar42 = vdivps_avx512vl(auVar41,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar38 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar40);
      uVar36 = vcmpps_avx512vl(auVar38,auVar39,1);
      auVar38 = vdivps_avx512vl(auVar41,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar40 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar40);
      uVar11 = vcmpps_avx512vl(auVar40,auVar39,1);
      auVar40 = vdivps_avx512vl(auVar41,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar25 = (bool)((byte)uVar26 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar42._0_4_;
      bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar42._4_4_;
      bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar42._8_4_;
      bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar42._12_4_;
      bVar25 = (bool)((byte)uVar36 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar38._0_4_;
      bVar25 = (bool)((byte)(uVar36 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar38._4_4_;
      bVar25 = (bool)((byte)(uVar36 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar38._8_4_;
      bVar25 = (bool)((byte)(uVar36 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar38._12_4_;
      bVar25 = (bool)((byte)uVar11 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar40._0_4_;
      bVar25 = (bool)((byte)(uVar11 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar40._4_4_;
      bVar25 = (bool)((byte)(uVar11 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar40._8_4_;
      bVar25 = (bool)((byte)(uVar11 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar25 * 0x5d5e0b6b | (uint)!bVar25 * auVar40._12_4_;
      auVar41 = ZEXT816(0);
      uVar26 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar41,1);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * auVar40._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar26 & 1) * auVar40._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * auVar40._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * auVar40._12_4_;
      uVar26 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar41,5);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar25 = (bool)((byte)uVar26 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar25 * auVar40._0_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar25 * auVar40._4_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar25 * auVar40._8_4_ | (uint)!bVar25 * 0x30;
      bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar25 * auVar40._12_4_ | (uint)!bVar25 * 0x30;
      uVar26 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar41,5);
      auVar40 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar25 = (bool)((byte)uVar26 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar25 * auVar40._0_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar25 * auVar40._4_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar25 * auVar40._8_4_ | (uint)!bVar25 * 0x50;
      bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar25 * auVar40._12_4_ | (uint)!bVar25 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar98 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar40 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar41);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar34 & 1) * auVar40._0_4_ |
           (uint)!(bool)(bVar34 & 1) * stack_near[0].field_0._0_4_;
      bVar25 = (bool)((byte)(uVar35 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar25 * auVar40._4_4_ | (uint)!bVar25 * stack_near[0].field_0._4_4_;
      bVar25 = (bool)((byte)(uVar35 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar25 * auVar40._8_4_ | (uint)!bVar25 * stack_near[0].field_0._8_4_;
      bVar25 = SUB81(uVar35 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar25 * auVar40._12_4_ | (uint)!bVar25 * stack_near[0].field_0._12_4_;
      auVar43 = vmaxps_avx512vl(auVar43,auVar41);
      tray.tfar.field_0.i[0] =
           (uint)(bVar34 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar34 & 1) * -0x800000;
      bVar25 = (bool)((byte)(uVar35 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar25 * auVar43._4_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = (bool)((byte)(uVar35 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar25 * auVar43._8_4_ | (uint)!bVar25 * -0x800000;
      bVar25 = SUB81(uVar35 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar25 * auVar43._12_4_ | (uint)!bVar25 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar33 = 3;
      }
      else {
        uVar33 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_18e4 = (ushort)uVar35 ^ 0xf;
      pNVar31 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar29 = &stack_near[2].field_0;
      stack_node[1].ptr = sVar28;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar99 = ZEXT1664(auVar43);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar100 = ZEXT1664(auVar43);
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar101 = ZEXT1664(auVar43);
LAB_01c9d9d8:
      do {
        do {
          root.ptr = pNVar31[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01c9dfd1;
          pNVar31 = pNVar31 + -1;
          vVar1.field_0 =
               *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                ((vfloat<4> *)paVar29)[-1].field_0.v;
          auVar102 = ZEXT1664((undefined1  [16])vVar1.field_0);
          paVar29 = &((vfloat<4> *)paVar29)[-1].field_0;
          uVar35 = vcmpps_avx512vl((undefined1  [16])vVar1.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar35 == '\0');
        uVar30 = (undefined4)uVar35;
        if (uVar33 < (uint)POPCOUNT(uVar30)) {
LAB_01c9da21:
          do {
            sVar28 = 8;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01c9dfd1;
              uVar10 = vcmpps_avx512vl(auVar102._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar10 != '\0') {
                bVar2 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar4 = This->leafIntersector;
                uVar35 = (ulong)(~(byte)local_18e4 & 0xf);
                bVar32 = 0;
                while (uVar35 != 0) {
                  lVar27 = 0;
                  for (uVar26 = uVar35; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000
                      ) {
                    lVar27 = lVar27 + 1;
                  }
                  uVar35 = uVar35 - 1 & uVar35;
                  cVar24 = (**(code **)((long)pvVar4 + (ulong)bVar2 * 0x40 + 0x18))
                                     (&pre,ray,lVar27,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  bVar15 = (byte)(1 << ((uint)lVar27 & 0x1f));
                  if (cVar24 == '\0') {
                    bVar15 = 0;
                  }
                  bVar32 = bVar32 | bVar15;
                }
                bVar32 = (byte)local_18e4 | bVar32;
                local_18e4 = (uint)bVar32;
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar95 = ZEXT1664(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar96 = ZEXT1664(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar97 = ZEXT1664(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar98 = ZEXT1664(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar99 = ZEXT1664(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar100 = ZEXT1664(auVar43);
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar101 = ZEXT1664(auVar43);
                if (bVar32 == 0xf) {
                  local_18e4._0_1_ = 0xf;
                  goto LAB_01c9dfd1;
                }
                auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar25 = (bool)(bVar32 >> 1 & 1);
                bVar5 = (bool)(bVar32 >> 2 & 1);
                bVar6 = (bool)(bVar32 >> 3 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar25 * auVar43._4_4_ | (uint)!bVar25 * tray.tfar.field_0.i[1];
                tray.tfar.field_0.i[0] =
                     (uint)(bVar32 & 1) * auVar43._0_4_ |
                     (uint)!(bool)(bVar32 & 1) * tray.tfar.field_0.i[0];
                tray.tfar.field_0.i[2] =
                     (uint)bVar5 * auVar43._8_4_ | (uint)!bVar5 * tray.tfar.field_0.i[2];
                tray.tfar.field_0.i[3] =
                     (uint)bVar6 * auVar43._12_4_ | (uint)!bVar6 * tray.tfar.field_0.i[3];
              }
              goto LAB_01c9d9d8;
            }
            uVar35 = root.ptr & 0xfffffffffffffff0;
            aVar59 = auVar98._0_16_;
            for (lVar27 = 0x1c;
                (auVar102 = ZEXT1664((undefined1  [16])aVar59), lVar27 != 0x20 &&
                (sVar3 = *(size_t *)((uVar35 - 0xe0) + lVar27 * 8), sVar3 != 8));
                lVar27 = lVar27 + 1) {
              if ((root.ptr & 7) == 0) {
                uVar30 = *(undefined4 *)((root.ptr - 0x50) + lVar27 * 4);
                auVar54._4_4_ = uVar30;
                auVar54._0_4_ = uVar30;
                auVar54._8_4_ = uVar30;
                auVar54._12_4_ = uVar30;
                auVar17._8_8_ = tray.org.field_0._8_8_;
                auVar17._0_8_ = tray.org.field_0._0_8_;
                auVar19._8_8_ = tray.org.field_0._24_8_;
                auVar19._0_8_ = tray.org.field_0._16_8_;
                auVar21._8_8_ = tray.org.field_0._40_8_;
                auVar21._0_8_ = tray.org.field_0._32_8_;
                auVar43 = vsubps_avx(auVar54,auVar17);
                auVar72._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar43._0_4_;
                auVar72._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar43._4_4_;
                auVar72._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar43._8_4_;
                auVar72._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar43._12_4_;
                uVar30 = *(undefined4 *)((root.ptr - 0x30) + lVar27 * 4);
                auVar55._4_4_ = uVar30;
                auVar55._0_4_ = uVar30;
                auVar55._8_4_ = uVar30;
                auVar55._12_4_ = uVar30;
                auVar43 = vsubps_avx(auVar55,auVar19);
                auVar77._0_4_ = tray.rdir.field_0._16_4_ * auVar43._0_4_;
                auVar77._4_4_ = tray.rdir.field_0._20_4_ * auVar43._4_4_;
                auVar77._8_4_ = tray.rdir.field_0._24_4_ * auVar43._8_4_;
                auVar77._12_4_ = tray.rdir.field_0._28_4_ * auVar43._12_4_;
                uVar30 = *(undefined4 *)((root.ptr - 0x10) + lVar27 * 4);
                auVar56._4_4_ = uVar30;
                auVar56._0_4_ = uVar30;
                auVar56._8_4_ = uVar30;
                auVar56._12_4_ = uVar30;
                auVar43 = vsubps_avx(auVar56,auVar21);
                auVar84._0_4_ = tray.rdir.field_0._32_4_ * auVar43._0_4_;
                auVar84._4_4_ = tray.rdir.field_0._36_4_ * auVar43._4_4_;
                auVar84._8_4_ = tray.rdir.field_0._40_4_ * auVar43._8_4_;
                auVar84._12_4_ = tray.rdir.field_0._44_4_ * auVar43._12_4_;
                uVar30 = *(undefined4 *)((root.ptr - 0x40) + lVar27 * 4);
                auVar57._4_4_ = uVar30;
                auVar57._0_4_ = uVar30;
                auVar57._8_4_ = uVar30;
                auVar57._12_4_ = uVar30;
                auVar43 = vsubps_avx(auVar57,auVar17);
                uVar30 = *(undefined4 *)((root.ptr - 0x20) + lVar27 * 4);
                auVar62._4_4_ = uVar30;
                auVar62._0_4_ = uVar30;
                auVar62._8_4_ = uVar30;
                auVar62._12_4_ = uVar30;
                auVar70._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar43._0_4_;
                auVar70._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar43._4_4_;
                auVar70._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar43._8_4_;
                auVar70._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar43._12_4_;
                auVar43 = vsubps_avx(auVar62,auVar19);
                auVar63._0_4_ = tray.rdir.field_0._16_4_ * auVar43._0_4_;
                auVar63._4_4_ = tray.rdir.field_0._20_4_ * auVar43._4_4_;
                auVar63._8_4_ = tray.rdir.field_0._24_4_ * auVar43._8_4_;
                auVar63._12_4_ = tray.rdir.field_0._28_4_ * auVar43._12_4_;
                uVar30 = *(undefined4 *)(root.ptr + lVar27 * 4);
                auVar58._4_4_ = uVar30;
                auVar58._0_4_ = uVar30;
                auVar58._8_4_ = uVar30;
                auVar58._12_4_ = uVar30;
                auVar43 = vsubps_avx(auVar58,auVar21);
                auVar65._0_4_ = tray.rdir.field_0._32_4_ * auVar43._0_4_;
                auVar65._4_4_ = tray.rdir.field_0._36_4_ * auVar43._4_4_;
                auVar65._8_4_ = tray.rdir.field_0._40_4_ * auVar43._8_4_;
                auVar65._12_4_ = tray.rdir.field_0._44_4_ * auVar43._12_4_;
                auVar43 = vminps_avx(auVar72,auVar70);
                auVar40 = vminps_avx(auVar77,auVar63);
                auVar43 = vmaxps_avx(auVar43,auVar40);
                auVar40 = vminps_avx(auVar84,auVar65);
                auVar43 = vmaxps_avx(auVar43,auVar40);
                auVar41 = vmulps_avx512vl(auVar43,auVar99._0_16_);
                auVar43 = vmaxps_avx(auVar72,auVar70);
                auVar40 = vmaxps_avx(auVar77,auVar63);
                auVar40 = vminps_avx(auVar43,auVar40);
                auVar43 = vmaxps_avx(auVar84,auVar65);
                auVar43 = vminps_avx(auVar40,auVar43);
                auVar40 = vmulps_avx512vl(auVar43,auVar100._0_16_);
                auVar43 = vmaxps_avx(auVar41,(undefined1  [16])tray.tnear.field_0);
                auVar40 = vminps_avx(auVar40,(undefined1  [16])tray.tfar.field_0);
              }
              else {
                uVar30 = *(undefined4 *)((uVar35 - 0x50) + lVar27 * 4);
                auVar66._4_4_ = uVar30;
                auVar66._0_4_ = uVar30;
                auVar66._8_4_ = uVar30;
                auVar66._12_4_ = uVar30;
                uVar30 = *(undefined4 *)((uVar35 - 0x40) + lVar27 * 4);
                auVar64._4_4_ = uVar30;
                auVar64._0_4_ = uVar30;
                auVar64._8_4_ = uVar30;
                auVar64._12_4_ = uVar30;
                uVar30 = *(undefined4 *)((uVar35 - 0x30) + lVar27 * 4);
                auVar60._4_4_ = uVar30;
                auVar60._0_4_ = uVar30;
                auVar60._8_4_ = uVar30;
                auVar60._12_4_ = uVar30;
                uVar30 = *(undefined4 *)((uVar35 - 0x20) + lVar27 * 4);
                auVar90._4_4_ = uVar30;
                auVar90._0_4_ = uVar30;
                auVar90._8_4_ = uVar30;
                auVar90._12_4_ = uVar30;
                uVar30 = *(undefined4 *)((uVar35 - 0x10) + lVar27 * 4);
                auVar87._4_4_ = uVar30;
                auVar87._0_4_ = uVar30;
                auVar87._8_4_ = uVar30;
                auVar87._12_4_ = uVar30;
                uVar30 = *(undefined4 *)(uVar35 + lVar27 * 4);
                auVar78._4_4_ = uVar30;
                auVar78._0_4_ = uVar30;
                auVar78._8_4_ = uVar30;
                auVar78._12_4_ = uVar30;
                fVar76 = *(float *)(uVar35 + 0x10 + lVar27 * 4);
                auVar75._4_4_ = fVar76;
                auVar75._0_4_ = fVar76;
                auVar75._8_4_ = fVar76;
                auVar75._12_4_ = fVar76;
                fVar79 = *(float *)(uVar35 + 0x20 + lVar27 * 4);
                auVar73._4_4_ = fVar79;
                auVar73._0_4_ = fVar79;
                auVar73._8_4_ = fVar79;
                auVar73._12_4_ = fVar79;
                fVar80 = *(float *)(uVar35 + 0x30 + lVar27 * 4);
                auVar68._4_4_ = fVar80;
                auVar68._0_4_ = fVar80;
                auVar68._8_4_ = fVar80;
                auVar68._12_4_ = fVar80;
                auVar18._8_8_ = tray.org.field_0._8_8_;
                auVar18._0_8_ = tray.org.field_0._0_8_;
                auVar20._8_8_ = tray.org.field_0._24_8_;
                auVar20._0_8_ = tray.org.field_0._16_8_;
                auVar22._8_8_ = tray.org.field_0._40_8_;
                auVar22._0_8_ = tray.org.field_0._32_8_;
                auVar43._0_4_ = (float)tray.dir.field_0._32_4_ * fVar76;
                auVar43._4_4_ = (float)tray.dir.field_0._36_4_ * fVar76;
                auVar43._8_4_ = (float)tray.dir.field_0._40_4_ * fVar76;
                auVar43._12_4_ = (float)tray.dir.field_0._44_4_ * fVar76;
                auVar40._0_4_ = (float)tray.dir.field_0._32_4_ * fVar79;
                auVar40._4_4_ = (float)tray.dir.field_0._36_4_ * fVar79;
                auVar40._8_4_ = (float)tray.dir.field_0._40_4_ * fVar79;
                auVar40._12_4_ = (float)tray.dir.field_0._44_4_ * fVar79;
                auVar41._0_4_ = (float)tray.dir.field_0._32_4_ * fVar80;
                auVar41._4_4_ = (float)tray.dir.field_0._36_4_ * fVar80;
                auVar41._8_4_ = (float)tray.dir.field_0._40_4_ * fVar80;
                auVar41._12_4_ = (float)tray.dir.field_0._44_4_ * fVar80;
                auVar43 = vfmadd231ps_avx512vl
                                    (auVar43,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar90);
                auVar40 = vfmadd231ps_avx512vl
                                    (auVar40,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                     auVar87);
                auVar41 = vfmadd231ps_avx512vl
                                    (auVar41,auVar78,
                                     (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                auVar43 = vfmadd231ps_fma(auVar43,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar66);
                auVar40 = vfmadd231ps_fma(auVar40,(undefined1  [16])
                                                  tray.dir.field_0.field_0.x.field_0,auVar64);
                auVar41 = vfmadd231ps_fma(auVar41,auVar60,
                                          (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                auVar42 = auVar95._0_16_;
                auVar39 = vandps_avx512vl(auVar43,auVar42);
                auVar38 = auVar96._0_16_;
                uVar26 = vcmpps_avx512vl(auVar39,auVar38,1);
                bVar25 = (bool)((byte)uVar26 & 1);
                iVar37 = auVar96._0_4_;
                auVar45._0_4_ = (uint)bVar25 * iVar37 | (uint)!bVar25 * auVar43._0_4_;
                bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
                iVar51 = auVar96._4_4_;
                auVar45._4_4_ = (uint)bVar25 * iVar51 | (uint)!bVar25 * auVar43._4_4_;
                bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
                iVar52 = auVar96._8_4_;
                iVar53 = auVar96._12_4_;
                auVar45._8_4_ = (uint)bVar25 * iVar52 | (uint)!bVar25 * auVar43._8_4_;
                bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
                auVar45._12_4_ = (uint)bVar25 * iVar53 | (uint)!bVar25 * auVar43._12_4_;
                auVar43 = vandps_avx512vl(auVar40,auVar42);
                uVar26 = vcmpps_avx512vl(auVar43,auVar38,1);
                bVar25 = (bool)((byte)uVar26 & 1);
                auVar46._0_4_ = (uint)bVar25 * iVar37 | (uint)!bVar25 * auVar40._0_4_;
                bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar25 * iVar51 | (uint)!bVar25 * auVar40._4_4_;
                bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar25 * iVar52 | (uint)!bVar25 * auVar40._8_4_;
                bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
                auVar46._12_4_ = (uint)bVar25 * iVar53 | (uint)!bVar25 * auVar40._12_4_;
                auVar43 = vandps_avx512vl(auVar41,auVar42);
                uVar26 = vcmpps_avx512vl(auVar43,auVar38,1);
                bVar25 = (bool)((byte)uVar26 & 1);
                auVar47._0_4_ = (uint)bVar25 * iVar37 | (uint)!bVar25 * auVar41._0_4_;
                bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
                auVar47._4_4_ = (uint)bVar25 * iVar51 | (uint)!bVar25 * auVar41._4_4_;
                bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
                auVar47._8_4_ = (uint)bVar25 * iVar52 | (uint)!bVar25 * auVar41._8_4_;
                bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
                auVar47._12_4_ = (uint)bVar25 * iVar53 | (uint)!bVar25 * auVar41._12_4_;
                auVar43 = vrcp14ps_avx512vl(auVar45);
                auVar39 = auVar97._0_16_;
                auVar40 = vfnmadd213ps_avx512vl(auVar45,auVar43,auVar39);
                auVar43 = vfmadd132ps_fma(auVar40,auVar43,auVar43);
                auVar40 = vrcp14ps_avx512vl(auVar46);
                auVar41 = vfnmadd213ps_avx512vl(auVar46,auVar40,auVar39);
                auVar40 = vfmadd132ps_fma(auVar41,auVar40,auVar40);
                auVar41 = vrcp14ps_avx512vl(auVar47);
                auVar39 = vfnmadd213ps_avx512vl(auVar47,auVar41,auVar39);
                auVar41 = vfmadd132ps_fma(auVar39,auVar41,auVar41);
                auVar50 = auVar101._0_16_;
                auVar48 = vxorps_avx512vl(auVar43,auVar50);
                auVar49 = vxorps_avx512vl(auVar40,auVar50);
                uVar30 = *(undefined4 *)(uVar35 + 0x40 + lVar27 * 4);
                auVar12._4_4_ = uVar30;
                auVar12._0_4_ = uVar30;
                auVar12._8_4_ = uVar30;
                auVar12._12_4_ = uVar30;
                auVar39 = vfmadd213ps_avx512vl(auVar75,auVar22,auVar12);
                uVar30 = *(undefined4 *)(uVar35 + 0x50 + lVar27 * 4);
                auVar13._4_4_ = uVar30;
                auVar13._0_4_ = uVar30;
                auVar13._8_4_ = uVar30;
                auVar13._12_4_ = uVar30;
                auVar42 = vfmadd213ps_avx512vl(auVar73,auVar22,auVar13);
                uVar30 = *(undefined4 *)(uVar35 + 0x60 + lVar27 * 4);
                auVar14._4_4_ = uVar30;
                auVar14._0_4_ = uVar30;
                auVar14._8_4_ = uVar30;
                auVar14._12_4_ = uVar30;
                auVar38 = vfmadd213ps_avx512vl(auVar68,auVar22,auVar14);
                auVar50 = vxorps_avx512vl(auVar41,auVar50);
                auVar39 = vfmadd231ps_fma(auVar39,auVar20,auVar90);
                auVar42 = vfmadd231ps_fma(auVar42,auVar20,auVar87);
                auVar38 = vfmadd231ps_fma(auVar38,auVar20,auVar78);
                auVar39 = vfmadd231ps_fma(auVar39,auVar18,auVar66);
                auVar67._0_4_ = auVar48._0_4_ * auVar39._0_4_;
                auVar67._4_4_ = auVar48._4_4_ * auVar39._4_4_;
                auVar67._8_4_ = auVar48._8_4_ * auVar39._8_4_;
                auVar67._12_4_ = auVar48._12_4_ * auVar39._12_4_;
                auVar39 = vfmadd231ps_fma(auVar42,auVar18,auVar64);
                auVar42 = vmulps_avx512vl(auVar39,auVar49);
                auVar39 = vfmadd231ps_fma(auVar38,auVar18,auVar60);
                auVar61._0_4_ = auVar50._0_4_ * auVar39._0_4_;
                auVar61._4_4_ = auVar50._4_4_ * auVar39._4_4_;
                auVar61._8_4_ = auVar50._8_4_ * auVar39._8_4_;
                auVar61._12_4_ = auVar50._12_4_ * auVar39._12_4_;
                auVar69._0_4_ = auVar43._0_4_ + auVar67._0_4_;
                auVar69._4_4_ = auVar43._4_4_ + auVar67._4_4_;
                auVar69._8_4_ = auVar43._8_4_ + auVar67._8_4_;
                auVar69._12_4_ = auVar43._12_4_ + auVar67._12_4_;
                auVar71._0_4_ = auVar40._0_4_ + auVar42._0_4_;
                auVar71._4_4_ = auVar40._4_4_ + auVar42._4_4_;
                auVar71._8_4_ = auVar40._8_4_ + auVar42._8_4_;
                auVar71._12_4_ = auVar40._12_4_ + auVar42._12_4_;
                auVar74._0_4_ = auVar41._0_4_ + auVar61._0_4_;
                auVar74._4_4_ = auVar41._4_4_ + auVar61._4_4_;
                auVar74._8_4_ = auVar41._8_4_ + auVar61._8_4_;
                auVar74._12_4_ = auVar41._12_4_ + auVar61._12_4_;
                auVar43 = vpminsd_avx(auVar67,auVar69);
                auVar40 = vpminsd_avx(auVar42,auVar71);
                auVar43 = vpmaxsd_avx(auVar43,auVar40);
                auVar40 = vpminsd_avx(auVar61,auVar74);
                auVar43 = vpmaxsd_avx(auVar43,auVar40);
                auVar40 = vpmaxsd_avx(auVar67,auVar69);
                auVar41 = vpmaxsd_avx(auVar42,auVar71);
                auVar41 = vpminsd_avx(auVar40,auVar41);
                auVar40 = vpmaxsd_avx(auVar61,auVar74);
                auVar40 = vpminsd_avx(auVar41,auVar40);
                auVar41 = vmulps_avx512vl(auVar43,auVar99._0_16_);
                auVar40 = vmulps_avx512vl(auVar40,auVar100._0_16_);
                auVar43 = vpmaxsd_avx(auVar41,(undefined1  [16])tray.tnear.field_0);
                auVar40 = vpminsd_avx(auVar40,(undefined1  [16])tray.tfar.field_0);
              }
              uVar26 = vcmpps_avx512vl(auVar43,auVar40,2);
              sVar23 = sVar28;
              aVar44 = aVar59;
              if ((uVar26 & 0xf) != 0) {
                auVar43 = vblendmps_avx512vl((undefined1  [16])auVar98._0_16_,auVar41);
                bVar25 = (bool)((byte)uVar26 & 1);
                aVar44._0_4_ = (uint)bVar25 * auVar43._0_4_ | (uint)!bVar25 * auVar41._0_4_;
                bVar25 = (bool)((byte)(uVar26 >> 1) & 1);
                aVar44._4_4_ = (uint)bVar25 * auVar43._4_4_ | (uint)!bVar25 * auVar41._4_4_;
                bVar25 = (bool)((byte)(uVar26 >> 2) & 1);
                aVar44._8_4_ = (uint)bVar25 * auVar43._8_4_ | (uint)!bVar25 * auVar41._8_4_;
                bVar25 = (bool)((byte)(uVar26 >> 3) & 1);
                aVar44._12_4_ = (uint)bVar25 * auVar43._12_4_ | (uint)!bVar25 * auVar41._12_4_;
                sVar23 = sVar3;
                if (sVar28 != 8) {
                  pNVar31->ptr = sVar28;
                  pNVar31 = pNVar31 + 1;
                  *paVar29 = aVar59;
                  paVar29 = paVar29 + 1;
                }
              }
              aVar59 = aVar44;
              sVar28 = sVar23;
            }
            if (sVar28 == 8) goto LAB_01c9dd82;
            uVar10 = vcmpps_avx512vl((undefined1  [16])aVar59,(undefined1  [16])tray.tfar.field_0,9)
            ;
            root.ptr = sVar28;
          } while ((byte)uVar33 < (byte)POPCOUNT((int)uVar10));
          pNVar31->ptr = sVar28;
          pNVar31 = pNVar31 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar29->v = aVar59;
          paVar29 = paVar29 + 1;
LAB_01c9dd82:
          iVar37 = 4;
        }
        else {
          while (uVar35 != 0) {
            sVar28 = 0;
            for (uVar26 = uVar35; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              sVar28 = sVar28 + 1;
            }
            uVar35 = uVar35 - 1 & uVar35;
            bVar25 = occluded1(This,bvh,root,sVar28,&pre,ray,&tray,context);
            bVar2 = (byte)(1 << ((uint)sVar28 & 0x1f));
            if (!bVar25) {
              bVar2 = 0;
            }
            local_18e4 = (uint)((byte)local_18e4 | bVar2);
          }
          iVar37 = 3;
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar95 = ZEXT1664(auVar43);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar96 = ZEXT1664(auVar43);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar97 = ZEXT1664(auVar43);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar98 = ZEXT1664(auVar43);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar99 = ZEXT1664(auVar43);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar100 = ZEXT1664(auVar43);
          auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar101 = ZEXT1664(auVar43);
          auVar102 = ZEXT1664((undefined1  [16])vVar1.field_0);
          if ((byte)local_18e4 != 0xf) {
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)((byte)local_18e4 & 1) * auVar43._0_4_ |
                 (uint)!(bool)((byte)local_18e4 & 1) * tray.tfar.field_0.i[0];
            bVar25 = (bool)((byte)(local_18e4 >> 1) & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar25 * auVar43._4_4_ | (uint)!bVar25 * tray.tfar.field_0.i[1];
            bVar25 = (bool)((byte)(local_18e4 >> 2) & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar25 * auVar43._8_4_ | (uint)!bVar25 * tray.tfar.field_0.i[2];
            bVar25 = (bool)((byte)(local_18e4 >> 3) & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar25 * auVar43._12_4_ | (uint)!bVar25 * tray.tfar.field_0.i[3];
            iVar37 = 2;
          }
          if (uVar33 < (uint)POPCOUNT(uVar30)) goto LAB_01c9da21;
        }
        if (iVar37 == 3) {
LAB_01c9dfd1:
          local_18e4._0_1_ = (byte)local_18e4 & bVar34;
          bVar25 = (bool)((byte)local_18e4 >> 1 & 1);
          bVar5 = (bool)((byte)local_18e4 >> 2 & 1);
          *(uint *)(ray + 0x80) =
               (uint)((byte)local_18e4 & 1) * -0x800000 |
               (uint)!(bool)((byte)local_18e4 & 1) * *(int *)(ray + 0x80);
          *(uint *)(ray + 0x84) = (uint)bVar25 * -0x800000 | (uint)!bVar25 * *(int *)(ray + 0x84);
          *(uint *)(ray + 0x88) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x88);
          *(uint *)(ray + 0x8c) =
               (uint)((byte)local_18e4 >> 3) * -0x800000 |
               (uint)!(bool)((byte)local_18e4 >> 3) * *(int *)(ray + 0x8c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }